

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O1

uint64_t helper_neon_uqadd_s64_arm(CPUARMState *env,uint64_t a,uint64_t b)

{
  ulong uVar1;
  uint64_t uVar2;
  
  uVar1 = b + a;
  if ((long)(~(uVar1 | a) & b) < 0) {
    uVar2 = 0xffffffffffffffff;
  }
  else {
    if (-1 < (long)(~b & a & uVar1)) {
      return uVar1;
    }
    uVar2 = 0;
  }
  (env->vfp).qc[0] = 1;
  return uVar2;
}

Assistant:

uint64_t HELPER(neon_uqadd_s64)(CPUARMState *env, uint64_t a, uint64_t b)
{
    uint64_t res;
    res = a + b;
    /* We only need to look at the pattern of SIGN bits to detect
     * +ve/-ve saturation
     */
    if (~a & b & ~res & SIGNBIT64) {
        SET_QC();
        res = UINT64_MAX;
    } else if (a & ~b & res & SIGNBIT64) {
        SET_QC();
        res = 0;
    }
    return res;
}